

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_avx2.c
# Opt level: O1

void aom_quantize_b_avx2(tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,
                        int16_t *round_ptr,int16_t *quant_ptr,int16_t *quant_shift_ptr,
                        tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,
                        uint16_t *eob_ptr,int16_t *scan,int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long lVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  auVar14 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])zbin_ptr),0x54);
  auVar12 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
  auVar6 = vpaddw_avx2(auVar14,auVar12);
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar3 = *(undefined1 (*) [16])dequant_ptr;
  auVar4 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar14 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar12 = vpabsw_avx2(auVar14);
  auVar7 = vpcmpgtw_avx2(auVar12,auVar6);
  if ((((((((((((((((((((((((((((((((auVar7 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar7 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar7 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar7 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar7 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar7 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar7 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar7 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar7 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar7 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar7 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar7 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar7 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar7 >> 0x7f,0) == '\0') &&
                    (auVar7 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar7 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar7 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar7 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar7 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar7 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar7 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar7 >> 0xbf,0) == '\0') &&
            (auVar7 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar7 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar7 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar7 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar7 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar7 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar7 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar7[0x1f]) {
    auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar12;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar12;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar12;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar12;
  }
  else {
    auVar13 = vpermq_avx2(ZEXT1632(auVar1),0x54);
    auVar12 = vpaddsw_avx2(auVar13,auVar12);
    auVar12 = vpand_avx2(auVar7,auVar12);
    auVar7 = vpermq_avx2(ZEXT1632(auVar2),0x54);
    auVar7 = vpmulhw_avx2(auVar7,auVar12);
    auVar12 = vpaddw_avx2(auVar7,auVar12);
    auVar7 = vpermq_avx2(ZEXT1632(auVar4),0x54);
    auVar7 = vpmulhw_avx2(auVar7,auVar12);
    auVar12 = vpcmpgtw_avx2(auVar7,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar7 = vpsignw_avx2(auVar7,auVar14);
    auVar14 = vpermq_avx2(ZEXT1632(auVar3),0x54);
    auVar14 = vpmullw_avx2(auVar7,auVar14);
    auVar16 = vpsraw_avx2(auVar7,0xf);
    auVar13 = vpunpcklwd_avx2(auVar7,auVar16);
    auVar7 = vpunpckhwd_avx2(auVar7,auVar16);
    *(undefined1 (*) [32])qcoeff_ptr = auVar13;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar7;
    auVar13 = vpsraw_avx2(auVar14,0xf);
    auVar7 = vpunpcklwd_avx2(auVar14,auVar13);
    auVar14 = vpunpckhwd_avx2(auVar14,auVar13);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar7;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar14;
  }
  auVar14 = vpermq_avx2(*(undefined1 (*) [32])iscan,0xd8);
  auVar14 = vpsubw_avx2(auVar14,auVar12);
  auVar12 = vpand_avx2(auVar14,auVar12);
  auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar12 = vpmaxsw_avx2(auVar12,auVar14);
  if (0x10 < n_coeffs) {
    auVar6 = vpshufd_avx2(auVar6,0xee);
    auVar7 = vpermq_avx2(ZEXT1632(auVar1),0x55);
    auVar13 = vpermq_avx2(ZEXT1632(auVar2),0x55);
    auVar16 = vpermq_avx2(ZEXT1632(auVar4),0x55);
    auVar9 = vpermq_avx2(ZEXT1632(auVar3),0x55);
    lVar11 = n_coeffs + 0x10;
    lVar10 = 0;
    do {
      auVar5 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar10 * 2 + 0x40),
                              *(undefined1 (*) [32])((long)coeff_ptr + lVar10 * 2 + 0x60));
      auVar15 = vpabsw_avx2(auVar5);
      auVar8 = vpcmpgtw_avx2(auVar15,auVar6);
      if ((((((((((((((((((((((((((((((((auVar8 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar8 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar8 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar8 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar8 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar8 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar8 >> 0x37 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar8 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar8 >> 0x4f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar8 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar8 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar8 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar8 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar8 >> 0x7f,0) == '\0') &&
                        (auVar8 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar8 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar8 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar8 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar8 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar8 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar8 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar8 >> 0xbf,0) == '\0') &&
                (auVar8 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar8 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar8 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar8 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar8 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar8 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar8 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar8[0x1f]) {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2 + 0x40) = auVar14;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2 + 0x40) = auVar14;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2 + 0x60) = auVar14;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2 + 0x60) = auVar14;
        auVar15 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar15 = vpaddsw_avx2(auVar15,auVar7);
        auVar15 = vpand_avx2(auVar8,auVar15);
        auVar8 = vpmulhw_avx2(auVar15,auVar13);
        auVar15 = vpaddw_avx2(auVar8,auVar15);
        auVar8 = vpmulhw_avx2(auVar15,auVar16);
        auVar15 = vpcmpgtw_avx2(auVar8,auVar14);
        auVar8 = vpsignw_avx2(auVar8,auVar5);
        auVar5 = vpmullw_avx2(auVar8,auVar9);
        auVar18 = vpsraw_avx2(auVar8,0xf);
        auVar17 = vpunpcklwd_avx2(auVar8,auVar18);
        auVar8 = vpunpckhwd_avx2(auVar8,auVar18);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2 + 0x40) = auVar17;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2 + 0x60) = auVar8;
        auVar17 = vpsraw_avx2(auVar5,0xf);
        auVar8 = vpunpcklwd_avx2(auVar5,auVar17);
        auVar5 = vpunpckhwd_avx2(auVar5,auVar17);
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2 + 0x40) = auVar8;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2 + 0x60) = auVar5;
      }
      auVar5 = vpermq_avx2(*(undefined1 (*) [32])((long)iscan + lVar10 + 0x20),0xd8);
      auVar5 = vpsubw_avx2(auVar5,auVar15);
      auVar15 = vpand_avx2(auVar5,auVar15);
      auVar12 = vpmaxsw_avx2(auVar12,auVar15);
      lVar11 = lVar11 + -0x10;
      lVar10 = lVar10 + 0x20;
    } while (0x20 < lVar11);
  }
  auVar1 = vpmaxsw_avx(auVar12._0_16_,auVar12._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,1);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  vpextrw_avx(auVar1,1);
  return;
}

Assistant:

void aom_quantize_b_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                         const int16_t *zbin_ptr, const int16_t *round_ptr,
                         const int16_t *quant_ptr,
                         const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
                         tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr,
                         uint16_t *eob_ptr, const int16_t *scan,
                         const int16_t *iscan) {
  (void)scan;
  __m256i v_zbin, v_round, v_quant, v_dequant, v_quant_shift;
  __m256i v_eobmax = _mm256_setzero_si256();

  load_b_values_avx2(zbin_ptr, &v_zbin, round_ptr, &v_round, quant_ptr,
                     &v_quant, dequant_ptr, &v_dequant, quant_shift_ptr,
                     &v_quant_shift, 0);

  // Do DC and first 15 AC.
  __m256i v_nz_mask =
      quantize_b_logscale0_16(coeff_ptr, qcoeff_ptr, dqcoeff_ptr, &v_quant,
                              &v_dequant, &v_round, &v_zbin, &v_quant_shift);

  v_eobmax = get_max_lane_eob(iscan, v_eobmax, v_nz_mask);

  v_round = _mm256_unpackhi_epi64(v_round, v_round);
  v_quant = _mm256_unpackhi_epi64(v_quant, v_quant);
  v_dequant = _mm256_unpackhi_epi64(v_dequant, v_dequant);
  v_quant_shift = _mm256_unpackhi_epi64(v_quant_shift, v_quant_shift);
  v_zbin = _mm256_unpackhi_epi64(v_zbin, v_zbin);

  for (intptr_t count = n_coeffs - 16; count > 0; count -= 16) {
    coeff_ptr += 16;
    qcoeff_ptr += 16;
    dqcoeff_ptr += 16;
    iscan += 16;
    v_nz_mask =
        quantize_b_logscale0_16(coeff_ptr, qcoeff_ptr, dqcoeff_ptr, &v_quant,
                                &v_dequant, &v_round, &v_zbin, &v_quant_shift);

    v_eobmax = get_max_lane_eob(iscan, v_eobmax, v_nz_mask);
  }

  *eob_ptr = accumulate_eob256(v_eobmax);
}